

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O0

void testPostfixUnary(TokenKind kind)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  bool bVar1;
  ExprLhs<const_slang::syntax::SyntaxKind_&> this;
  MessageStream *pMVar2;
  PostfixUnaryExpressionSyntax *lhs;
  ExprLhs<const_slang::parsing::TokenKind_&> EVar3;
  ExprLhs<slang::syntax::SyntaxKind_&> this_00;
  TokenKind in_DI;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  PostfixUnaryExpressionSyntax *us;
  AssertionHandler catchAssertionHandler_2;
  string *in_stack_00000300;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  ExpressionSyntax *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 uVar4;
  OfType in_stack_fffffffffffffb1c;
  AssertionHandler *in_stack_fffffffffffffb20;
  SourceManager *in_stack_fffffffffffffb28;
  Diagnostics *in_stack_fffffffffffffb30;
  SourceLineInfo *this_01;
  char *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  SourceLineInfo *this_02;
  ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffb48;
  Flags resultDisposition;
  allocator<char> *in_stack_fffffffffffffb50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  SourceLineInfo local_408;
  StringRef local_3f8;
  TokenKind *local_398;
  StringRef local_360;
  SourceLineInfo local_350;
  StringRef local_340;
  PostfixUnaryExpressionSyntax *local_2e8;
  undefined1 local_2d8 [32];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  StringRef local_288;
  SourceLineInfo local_270;
  StringRef local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  StringRef local_1a8;
  SourceLineInfo local_198;
  StringRef local_188;
  SyntaxKind local_130;
  SyntaxKind *local_128;
  StringRef local_f0;
  SourceLineInfo local_e0;
  StringRef local_d0;
  SyntaxNode *local_78;
  allocator<char> local_59;
  string_view local_58;
  TokenKind local_2;
  
  local_2 = in_DI;
  local_58 = slang::parsing::LexerFacts::getTokenKindText
                       ((TokenKind)((ulong)in_stack_fffffffffffffb20 >> 0x30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  resultDisposition = (Flags)in_stack_fffffffffffffb50;
  std::operator+((char *)in_stack_fffffffffffffb28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb20);
  std::allocator<char>::~allocator(&local_59);
  local_78 = &parseExpression(in_stack_00000300)->super_SyntaxNode;
  local_d0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffb20,
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0x91);
  local_f0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffb20,
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
  uVar4 = 1;
  macroName.m_size = (size_type)in_stack_fffffffffffffb40;
  macroName.m_start = in_stack_fffffffffffffb38;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffb30;
  capturedExpression.m_start = (char *)in_stack_fffffffffffffb28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb20,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb1c,1),capturedExpression,
             resultDisposition);
  this = Catch::operator<=<const_slang::syntax::SyntaxKind_&,_0>
                   ((Decomposer *)CONCAT44(in_stack_fffffffffffffb1c,uVar4),(SyntaxKind *)0x5988c4);
  local_128 = this.m_lhs;
  local_130 = slang::syntax::SyntaxFacts::getUnaryPostfixExpression(local_2);
  Catch::operator==((ExprLhs<const_slang::syntax::SyntaxKind_&> *)in_stack_fffffffffffffb48,
                    (SyntaxKind *)in_stack_fffffffffffffb40);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb20,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb1c,uVar4));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb20);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb20);
  local_188 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_198,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0x92);
  local_1a8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4)
                        );
  uVar4 = 2;
  macroName_00.m_size = (size_type)in_stack_fffffffffffffb40;
  macroName_00.m_start = in_stack_fffffffffffffb38;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffb30;
  capturedExpression_00.m_start = (char *)in_stack_fffffffffffffb28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb20,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb1c,2),capturedExpression_00,
             resultDisposition);
  slang::syntax::SyntaxNode::toString_abi_cxx11_((SyntaxNode *)this.m_lhs);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              Catch::
              operator<=<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffb1c,uVar4),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x598ab5);
  Catch::operator==(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb20,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb1c,uVar4));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb20);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb20);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb20);
  getSourceManager();
  slang::Diagnostics::sort(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  bVar1 = slang::SmallVectorBase<slang::Diagnostic>::empty
                    ((SmallVectorBase<slang::Diagnostic> *)slang::diagnostics);
  if (!bVar1) {
    local_260 = operator____catch_sr
                          ((char *)in_stack_fffffffffffffb20,
                           CONCAT44(in_stack_fffffffffffffb1c,uVar4));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
               ,0x93);
    local_288.m_start = (char *)0x0;
    local_288.m_size = 0;
    Catch::StringRef::StringRef(&local_288);
    uVar4 = 2;
    macroName_01.m_size = (size_type)in_stack_fffffffffffffb40;
    macroName_01.m_start = in_stack_fffffffffffffb38;
    capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffb30;
    capturedExpression_01.m_start = (char *)in_stack_fffffffffffffb28;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffffb20,macroName_01,
               (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb1c,2),capturedExpression_01,
               resultDisposition);
    local_2b8 = 0;
    uStack_2b0 = 0;
    Catch::MessageStream::MessageStream((MessageStream *)0x598cb3);
    reportGlobalDiags_abi_cxx11_();
    Catch::operator+(local_2d8);
    pMVar2 = Catch::MessageStream::operator<<
                       ((MessageStream *)in_stack_fffffffffffffb20,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffb1c,uVar4));
    resultDisposition = (Flags)pMVar2;
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffffb1c,uVar4));
    Catch::AssertionHandler::handleMessage
              (in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,(string *)0x598d1f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb20);
    Catch::MessageStream::~MessageStream((MessageStream *)0x598d48);
    Catch::AssertionHandler::complete(in_stack_fffffffffffffb20);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb20);
  }
  lhs = slang::syntax::SyntaxNode::as<slang::syntax::PostfixUnaryExpressionSyntax>(local_78);
  local_2e8 = lhs;
  local_340 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4)
                        );
  this_02 = &local_350;
  Catch::SourceLineInfo::SourceLineInfo
            (this_02,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0x95);
  local_360 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4)
                        );
  uVar4 = 2;
  macroName_02.m_size = (size_type)this_02;
  macroName_02.m_start = in_stack_fffffffffffffb38;
  capturedExpression_02.m_size = (size_type)in_stack_fffffffffffffb30;
  capturedExpression_02.m_start = (char *)in_stack_fffffffffffffb28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb20,macroName_02,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb1c,2),capturedExpression_02,
             resultDisposition);
  EVar3 = Catch::operator<=<const_slang::parsing::TokenKind_&,_0>
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffb1c,uVar4),(TokenKind *)0x598f1a);
  local_398 = EVar3.m_lhs;
  Catch::operator==((ExprLhs<const_slang::parsing::TokenKind_&> *)lhs,(TokenKind *)this_02);
  Catch::AssertionHandler::handleExpr
            (in_stack_fffffffffffffb20,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb1c,uVar4));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffb20);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffb20);
  local_3f8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4)
                        );
  this_01 = &local_408;
  Catch::SourceLineInfo::SourceLineInfo
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/ExpressionParsingTests.cpp"
             ,0x96);
  operator____catch_sr((char *)in_stack_fffffffffffffb20,CONCAT44(in_stack_fffffffffffffb1c,uVar4));
  uVar4 = 2;
  macroName_03.m_size = (size_type)this_02;
  macroName_03.m_start = (char *)EVar3.m_lhs;
  capturedExpression_03.m_size = (size_type)this_01;
  capturedExpression_03.m_start = (char *)in_stack_fffffffffffffb28;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffb20,macroName_03,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffb1c,2),capturedExpression_03,
             resultDisposition);
  slang::not_null<slang::syntax::ExpressionSyntax_*>::operator->
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x59906d);
  this_00 = Catch::operator<=<slang::syntax::SyntaxKind_&,_0>
                      ((Decomposer *)CONCAT44(in_stack_fffffffffffffb1c,uVar4),
                       (SyntaxKind *)0x599086);
  Catch::operator==((ExprLhs<slang::syntax::SyntaxKind_&> *)lhs,(SyntaxKind *)this_02);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)this_00.m_lhs,
             (ITransientExpression *)CONCAT44(in_stack_fffffffffffffb1c,uVar4));
  Catch::AssertionHandler::complete((AssertionHandler *)this_00.m_lhs);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)this_00.m_lhs);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00.m_lhs);
  return;
}

Assistant:

void testPostfixUnary(TokenKind kind) {
    auto text = "a" + std::string(LF::getTokenKindText(kind));
    auto& expr = parseExpression(text);

    REQUIRE(expr.kind == SyntaxFacts::getUnaryPostfixExpression(kind));
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
    auto& us = expr.as<PostfixUnaryExpressionSyntax>();
    CHECK(us.operatorToken.kind == kind);
    CHECK(us.operand->kind == SyntaxKind::IdentifierName);
}